

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O0

void __thiscall QComboMenuDelegate::~QComboMenuDelegate(QComboMenuDelegate *this)

{
  void *in_RDI;
  
  ~QComboMenuDelegate((QComboMenuDelegate *)0x544e0c);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QComboMenuDelegate : public QAbstractItemDelegate
{
    Q_OBJECT
public:
    QComboMenuDelegate(QObject *parent, QComboBox *cmb)
    : QAbstractItemDelegate(parent), mCombo(cmb), pressedIndex(-1)
    {}

protected:
    void paint(QPainter *painter,
               const QStyleOptionViewItem &option,
               const QModelIndex &index) const override {
        QStyleOptionMenuItem opt = getStyleOption(option, index);
        painter->fillRect(option.rect, opt.palette.window());
        mCombo->style()->drawControl(QStyle::CE_MenuItem, &opt, painter, mCombo);
    }